

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O3

void av1_fwd_txfm2d_8x32_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined4 *puVar3;
  undefined4 *puVar4;
  undefined4 *puVar5;
  undefined8 *puVar6;
  code *pcVar7;
  code *pcVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  int8_t *piVar19;
  long lVar20;
  int32_t *piVar21;
  undefined7 in_register_00000009;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  int iVar27;
  long lVar28;
  undefined1 *puVar29;
  ulong uVar30;
  int16_t *topL_1;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar63 [16];
  __m128i local_438;
  undefined1 local_428 [16];
  int local_418;
  undefined4 uStack_414;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  undefined1 local_408 [16];
  int local_3f8;
  undefined4 uStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  int local_3c8;
  undefined4 uStack_3c4;
  undefined4 uStack_3c0;
  undefined4 uStack_3bc;
  int local_3b8;
  undefined4 uStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined1 local_3a8 [16];
  int local_398;
  undefined4 uStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  int local_388;
  undefined4 uStack_384;
  undefined4 uStack_380;
  undefined4 uStack_37c;
  int local_378;
  undefined4 uStack_374;
  undefined4 uStack_370;
  undefined4 uStack_36c;
  int local_368;
  undefined4 uStack_364;
  undefined4 uStack_360;
  undefined4 uStack_35c;
  int local_358;
  undefined4 uStack_354;
  undefined4 uStack_350;
  undefined4 uStack_34c;
  int local_348;
  undefined4 uStack_344;
  undefined4 uStack_340;
  undefined4 uStack_33c;
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  int local_2c8;
  undefined4 uStack_2c4;
  undefined4 uStack_2c0;
  undefined4 uStack_2bc;
  int local_2b8;
  undefined4 uStack_2b4;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  int local_2a8;
  undefined4 uStack_2a4;
  undefined4 uStack_2a0;
  undefined4 uStack_29c;
  int local_298;
  undefined4 uStack_294;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  int local_288;
  undefined4 uStack_284;
  undefined4 uStack_280;
  undefined4 uStack_27c;
  int local_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  int local_268;
  undefined4 uStack_264;
  undefined4 uStack_260;
  undefined4 uStack_25c;
  int local_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  int local_1c8;
  undefined4 uStack_1c4;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  int local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  int local_1a8;
  undefined4 uStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  int local_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  int local_188;
  undefined4 uStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  int local_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined1 local_168 [16];
  int local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  int local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  int local_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined1 local_128 [16];
  int local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined1 local_108 [16];
  int local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  int local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  int local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined1 local_a8 [16];
  int local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined1 local_88 [16];
  int local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 local_68 [16];
  int local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  int local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  piVar19 = av1_fwd_txfm_shift_ls[0xf];
  iVar27 = (int)*av1_fwd_txfm_shift_ls[0xf];
  pauVar1 = (undefined1 (*) [16])(input + stride * 8);
  auVar38 = *(undefined1 (*) [16])input;
  lVar20 = (long)stride;
  auVar33 = *(undefined1 (*) [16])(input + lVar20);
  lVar22 = (long)(stride * 2);
  auVar43 = *(undefined1 (*) [16])(input + lVar22);
  lVar23 = (long)(stride * 3);
  auVar32 = *(undefined1 (*) [16])(input + lVar23);
  lVar24 = (long)(stride * 4);
  auVar36 = *(undefined1 (*) [16])(input + lVar24);
  lVar25 = (long)(stride * 5);
  auVar35 = *(undefined1 (*) [16])(input + lVar25);
  lVar26 = (long)(stride * 6);
  auVar41 = *(undefined1 (*) [16])(input + lVar26);
  puVar29 = local_3d8;
  lVar28 = (long)(stride * 7);
  auVar34 = *(undefined1 (*) [16])(input + lVar28);
  auVar56 = pmovsxwd(in_XMM8,auVar38);
  local_438[0]._0_4_ = auVar56._0_4_ << iVar27;
  local_438[0]._4_4_ = auVar56._4_4_;
  local_438[1]._0_4_ = auVar56._8_4_;
  local_438[1]._4_4_ = auVar56._12_4_;
  auVar57 = pmovsxwd((undefined1  [16])local_438,auVar36);
  auVar51._8_4_ = auVar36._8_4_;
  auVar51._12_4_ = auVar36._12_4_;
  auVar51._0_8_ = auVar36._8_8_;
  auVar52 = pmovsxwd(auVar51,auVar51);
  auVar37._8_4_ = auVar38._8_4_;
  auVar37._12_4_ = auVar38._12_4_;
  auVar37._0_8_ = auVar38._8_8_;
  auVar38 = pmovsxwd(auVar37,auVar37);
  local_428._0_4_ = auVar38._0_4_ << iVar27;
  local_428._4_4_ = auVar38._4_4_;
  local_428._8_4_ = auVar38._8_4_;
  local_428._12_4_ = auVar38._12_4_;
  auVar38 = pmovsxwd(local_428,auVar33);
  local_418 = auVar38._0_4_ << iVar27;
  uStack_414 = auVar38._4_4_;
  uStack_410 = auVar38._8_4_;
  uStack_40c = auVar38._12_4_;
  auVar63 = pmovsxwd(in_XMM10,auVar35);
  auVar39._0_8_ = auVar35._8_8_;
  auVar39._8_4_ = auVar35._8_4_;
  auVar39._12_4_ = auVar35._12_4_;
  auVar56 = pmovsxwd(auVar39,auVar39);
  auVar47._8_4_ = auVar33._8_4_;
  auVar47._12_4_ = auVar33._12_4_;
  auVar47._0_8_ = auVar33._8_8_;
  auVar38 = pmovsxwd(auVar47,auVar47);
  local_408._0_4_ = auVar38._0_4_ << iVar27;
  local_408._4_4_ = auVar38._4_4_;
  local_408._8_4_ = auVar38._8_4_;
  local_408._12_4_ = auVar38._12_4_;
  auVar38 = pmovsxwd(local_408,auVar43);
  local_3f8 = auVar38._0_4_ << iVar27;
  uStack_3f4 = auVar38._4_4_;
  uStack_3f0 = auVar38._8_4_;
  uStack_3ec = auVar38._12_4_;
  auVar47 = pmovsxwd(auVar35,auVar41);
  auVar53._0_8_ = auVar41._8_8_;
  auVar53._8_4_ = auVar41._8_4_;
  auVar53._12_4_ = auVar41._12_4_;
  auVar35 = pmovsxwd(auVar53,auVar53);
  auVar36._8_4_ = auVar43._8_4_;
  auVar36._12_4_ = auVar43._12_4_;
  auVar36._0_8_ = auVar43._8_8_;
  auVar38 = pmovsxwd(auVar36,auVar36);
  local_3e8._0_4_ = auVar38._0_4_ << iVar27;
  local_3e8._4_4_ = auVar38._4_4_;
  local_3e8._8_4_ = auVar38._8_4_;
  local_3e8._12_4_ = auVar38._12_4_;
  auVar38 = pmovsxwd(local_3e8,auVar32);
  local_3d8._0_4_ = auVar38._0_4_ << iVar27;
  local_3d8._4_4_ = auVar38._4_4_;
  local_3d8._8_4_ = auVar38._8_4_;
  local_3d8._12_4_ = auVar38._12_4_;
  auVar33 = pmovsxwd(local_3d8,auVar34);
  auVar42._0_8_ = auVar34._8_8_;
  auVar42._8_4_ = auVar34._8_4_;
  auVar42._12_4_ = auVar34._12_4_;
  auVar43 = pmovsxwd(auVar42,auVar42);
  auVar38._8_4_ = auVar32._8_4_;
  auVar38._12_4_ = auVar32._12_4_;
  auVar38._0_8_ = auVar32._8_8_;
  auVar38 = pmovsxwd(auVar38,auVar38);
  local_3c8 = auVar38._0_4_ << iVar27;
  uStack_3c4 = auVar38._4_4_;
  uStack_3c0 = auVar38._8_4_;
  uStack_3bc = auVar38._12_4_;
  local_3b8 = auVar57._0_4_ << iVar27;
  uStack_3b4 = auVar57._4_4_;
  uStack_3b0 = auVar57._8_4_;
  uStack_3ac = auVar57._12_4_;
  local_3a8._0_4_ = auVar52._0_4_ << iVar27;
  local_3a8._4_4_ = auVar52._4_4_;
  local_3a8._8_4_ = auVar52._8_4_;
  local_3a8._12_4_ = auVar52._12_4_;
  local_398 = auVar63._0_4_ << iVar27;
  uStack_394 = auVar63._4_4_;
  uStack_390 = auVar63._8_4_;
  uStack_38c = auVar63._12_4_;
  local_388 = auVar56._0_4_ << iVar27;
  uStack_384 = auVar56._4_4_;
  uStack_380 = auVar56._8_4_;
  uStack_37c = auVar56._12_4_;
  local_378 = auVar47._0_4_ << iVar27;
  uStack_374 = auVar47._4_4_;
  uStack_370 = auVar47._8_4_;
  uStack_36c = auVar47._12_4_;
  local_368 = auVar35._0_4_ << iVar27;
  uStack_364 = auVar35._4_4_;
  uStack_360 = auVar35._8_4_;
  uStack_35c = auVar35._12_4_;
  local_358 = auVar33._0_4_ << iVar27;
  uStack_354 = auVar33._4_4_;
  uStack_350 = auVar33._8_4_;
  uStack_34c = auVar33._12_4_;
  local_348 = auVar43._0_4_ << iVar27;
  uStack_344 = auVar43._4_4_;
  uStack_340 = auVar43._8_4_;
  uStack_33c = auVar43._12_4_;
  auVar38 = *pauVar1;
  auVar33 = *(undefined1 (*) [16])(*pauVar1 + lVar20 * 2);
  auVar43 = *(undefined1 (*) [16])(*pauVar1 + lVar22 * 2);
  auVar32 = *(undefined1 (*) [16])(*pauVar1 + lVar23 * 2);
  auVar36 = *(undefined1 (*) [16])(*pauVar1 + lVar24 * 2);
  auVar35 = *(undefined1 (*) [16])(*pauVar1 + lVar25 * 2);
  auVar41 = *(undefined1 (*) [16])(*pauVar1 + lVar26 * 2);
  auVar34 = *(undefined1 (*) [16])(*pauVar1 + lVar28 * 2);
  auVar56 = pmovsxwd(local_3a8,auVar38);
  local_338._0_4_ = auVar56._0_4_ << iVar27;
  local_338._4_4_ = auVar56._4_4_;
  local_338._8_4_ = auVar56._8_4_;
  local_338._12_4_ = auVar56._12_4_;
  auVar53 = pmovsxwd(local_338,auVar36);
  auVar48._8_4_ = auVar36._8_4_;
  auVar48._12_4_ = auVar36._12_4_;
  auVar48._0_8_ = auVar36._8_8_;
  auVar47 = pmovsxwd(auVar48,auVar48);
  auVar61._8_4_ = auVar38._8_4_;
  auVar61._12_4_ = auVar38._12_4_;
  auVar61._0_8_ = auVar38._8_8_;
  auVar38 = pmovsxwd(auVar61,auVar61);
  local_328._0_4_ = auVar38._0_4_ << iVar27;
  local_328._4_4_ = auVar38._4_4_;
  local_328._8_4_ = auVar38._8_4_;
  local_328._12_4_ = auVar38._12_4_;
  auVar38 = pmovsxwd(local_328,auVar33);
  local_318._0_4_ = auVar38._0_4_ << iVar27;
  local_318._4_4_ = auVar38._4_4_;
  local_318._8_4_ = auVar38._8_4_;
  local_318._12_4_ = auVar38._12_4_;
  auVar63 = pmovsxwd(local_318,auVar35);
  auVar58._8_4_ = auVar35._8_4_;
  auVar58._12_4_ = auVar35._12_4_;
  auVar58._0_8_ = auVar35._8_8_;
  auVar57 = pmovsxwd(auVar58,auVar58);
  auVar44._8_4_ = auVar33._8_4_;
  auVar44._12_4_ = auVar33._12_4_;
  auVar44._0_8_ = auVar33._8_8_;
  auVar38 = pmovsxwd(auVar44,auVar44);
  local_308._0_4_ = auVar38._0_4_ << iVar27;
  local_308._4_4_ = auVar38._4_4_;
  local_308._8_4_ = auVar38._8_4_;
  local_308._12_4_ = auVar38._12_4_;
  auVar38 = pmovsxwd(local_308,auVar43);
  local_2f8._0_4_ = auVar38._0_4_ << iVar27;
  local_2f8._4_4_ = auVar38._4_4_;
  local_2f8._8_4_ = auVar38._8_4_;
  local_2f8._12_4_ = auVar38._12_4_;
  auVar56 = pmovsxwd(local_2f8,auVar41);
  auVar40._8_4_ = auVar41._8_4_;
  auVar40._12_4_ = auVar41._12_4_;
  auVar40._0_8_ = auVar41._8_8_;
  auVar41 = pmovsxwd(auVar40,auVar40);
  auVar52._8_4_ = auVar43._8_4_;
  auVar52._12_4_ = auVar43._12_4_;
  auVar52._0_8_ = auVar43._8_8_;
  auVar38 = pmovsxwd(auVar52,auVar52);
  local_2e8._0_4_ = auVar38._0_4_ << iVar27;
  local_2e8._4_4_ = auVar38._4_4_;
  local_2e8._8_4_ = auVar38._8_4_;
  local_2e8._12_4_ = auVar38._12_4_;
  auVar38 = pmovsxwd(local_2e8,auVar32);
  local_2d8._0_4_ = auVar38._0_4_ << iVar27;
  local_2d8._4_4_ = auVar38._4_4_;
  local_2d8._8_4_ = auVar38._8_4_;
  local_2d8._12_4_ = auVar38._12_4_;
  auVar36 = pmovsxwd(local_2d8,auVar34);
  auVar35._8_4_ = auVar34._8_4_;
  auVar35._12_4_ = auVar34._12_4_;
  auVar35._0_8_ = auVar34._8_8_;
  auVar43 = pmovsxwd(auVar35,auVar35);
  auVar33._8_4_ = auVar32._8_4_;
  auVar33._12_4_ = auVar32._12_4_;
  auVar33._0_8_ = auVar32._8_8_;
  auVar38 = pmovsxwd(auVar33,auVar33);
  local_2c8 = auVar38._0_4_ << iVar27;
  uStack_2c4 = auVar38._4_4_;
  uStack_2c0 = auVar38._8_4_;
  uStack_2bc = auVar38._12_4_;
  local_2b8 = auVar53._0_4_ << iVar27;
  uStack_2b4 = auVar53._4_4_;
  uStack_2b0 = auVar53._8_4_;
  uStack_2ac = auVar53._12_4_;
  local_2a8 = auVar47._0_4_ << iVar27;
  uStack_2a4 = auVar47._4_4_;
  uStack_2a0 = auVar47._8_4_;
  uStack_29c = auVar47._12_4_;
  local_298 = auVar63._0_4_ << iVar27;
  uStack_294 = auVar63._4_4_;
  uStack_290 = auVar63._8_4_;
  uStack_28c = auVar63._12_4_;
  local_288 = auVar57._0_4_ << iVar27;
  uStack_284 = auVar57._4_4_;
  uStack_280 = auVar57._8_4_;
  uStack_27c = auVar57._12_4_;
  local_278 = auVar56._0_4_ << iVar27;
  uStack_274 = auVar56._4_4_;
  uStack_270 = auVar56._8_4_;
  uStack_26c = auVar56._12_4_;
  local_268 = auVar41._0_4_ << iVar27;
  uStack_264 = auVar41._4_4_;
  uStack_260 = auVar41._8_4_;
  uStack_25c = auVar41._12_4_;
  local_258 = auVar36._0_4_ << iVar27;
  uStack_254 = auVar36._4_4_;
  uStack_250 = auVar36._8_4_;
  uStack_24c = auVar36._12_4_;
  local_248._0_4_ = auVar43._0_4_ << iVar27;
  local_248._4_4_ = auVar43._4_4_;
  local_248._8_4_ = auVar43._8_4_;
  local_248._12_4_ = auVar43._12_4_;
  pauVar1 = (undefined1 (*) [16])(input + (stride << 4));
  local_48 = (int)*av1_fwd_txfm_shift_ls[0xf];
  pauVar2 = (undefined1 (*) [16])(*pauVar1 + (long)(stride * 8) * 2);
  auVar38 = *pauVar1;
  auVar33 = *(undefined1 (*) [16])(*pauVar1 + lVar20 * 2);
  auVar43 = *(undefined1 (*) [16])(*pauVar1 + lVar22 * 2);
  auVar32 = *(undefined1 (*) [16])(*pauVar1 + lVar23 * 2);
  auVar36 = *(undefined1 (*) [16])(*pauVar1 + lVar24 * 2);
  auVar35 = *(undefined1 (*) [16])(*pauVar1 + lVar25 * 2);
  auVar41 = *(undefined1 (*) [16])(*pauVar1 + lVar26 * 2);
  auVar34 = pmovsxwd(local_248,auVar38);
  local_238._0_4_ = auVar34._0_4_ << local_48;
  local_238._4_4_ = auVar34._4_4_;
  local_238._8_4_ = auVar34._8_4_;
  local_238._12_4_ = auVar34._12_4_;
  auVar34 = *(undefined1 (*) [16])(*pauVar1 + lVar28 * 2);
  auVar56 = pmovsxwd(local_238,auVar36);
  auVar45._8_4_ = auVar36._8_4_;
  auVar45._12_4_ = auVar36._12_4_;
  auVar45._0_8_ = auVar36._8_8_;
  auVar57._8_4_ = auVar38._8_4_;
  auVar57._12_4_ = auVar38._12_4_;
  auVar57._0_8_ = auVar38._8_8_;
  auVar38 = pmovsxwd(auVar57,auVar57);
  local_228._0_4_ = auVar38._0_4_ << local_48;
  local_228._4_4_ = auVar38._4_4_;
  local_228._8_4_ = auVar38._8_4_;
  local_228._12_4_ = auVar38._12_4_;
  auVar38 = pmovsxwd(local_228,auVar33);
  local_218._0_4_ = auVar38._0_4_ << local_48;
  local_218._4_4_ = auVar38._4_4_;
  local_218._8_4_ = auVar38._8_4_;
  local_218._12_4_ = auVar38._12_4_;
  auVar47 = pmovsxwd(auVar45,auVar45);
  auVar36 = pmovsxwd(local_218,auVar35);
  auVar59._8_4_ = auVar35._8_4_;
  auVar59._12_4_ = auVar35._12_4_;
  auVar59._0_8_ = auVar35._8_8_;
  auVar54._8_4_ = auVar33._8_4_;
  auVar54._12_4_ = auVar33._12_4_;
  auVar54._0_8_ = auVar33._8_8_;
  auVar38 = pmovsxwd(auVar54,auVar54);
  local_208._0_4_ = auVar38._0_4_ << local_48;
  local_208._4_4_ = auVar38._4_4_;
  local_208._8_4_ = auVar38._8_4_;
  local_208._12_4_ = auVar38._12_4_;
  auVar38 = pmovsxwd(local_208,auVar43);
  local_1f8._0_4_ = auVar38._0_4_ << local_48;
  local_1f8._4_4_ = auVar38._4_4_;
  local_1f8._8_4_ = auVar38._8_4_;
  local_1f8._12_4_ = auVar38._12_4_;
  auVar53 = pmovsxwd(auVar59,auVar59);
  auVar35 = pmovsxwd(local_1f8,auVar41);
  auVar62._8_4_ = auVar41._8_4_;
  auVar62._12_4_ = auVar41._12_4_;
  auVar62._0_8_ = auVar41._8_8_;
  auVar49._8_4_ = auVar43._8_4_;
  auVar49._12_4_ = auVar43._12_4_;
  auVar49._0_8_ = auVar43._8_8_;
  auVar38 = pmovsxwd(auVar49,auVar49);
  local_1e8._0_4_ = auVar38._0_4_ << local_48;
  local_1e8._4_4_ = auVar38._4_4_;
  local_1e8._8_4_ = auVar38._8_4_;
  local_1e8._12_4_ = auVar38._12_4_;
  auVar38 = pmovsxwd(local_1e8,auVar32);
  local_1d8._0_4_ = auVar38._0_4_ << local_48;
  local_1d8._4_4_ = auVar38._4_4_;
  local_1d8._8_4_ = auVar38._8_4_;
  local_1d8._12_4_ = auVar38._12_4_;
  auVar41 = pmovsxwd(auVar62,auVar62);
  auVar33 = pmovsxwd(local_1d8,auVar34);
  auVar34._0_8_ = auVar34._8_8_;
  auVar43._8_4_ = auVar32._8_4_;
  auVar43._12_4_ = auVar32._12_4_;
  auVar43._0_8_ = auVar32._8_8_;
  auVar38 = pmovsxwd(auVar43,auVar43);
  local_1c8 = auVar38._0_4_ << local_48;
  uStack_1c4 = auVar38._4_4_;
  uStack_1c0 = auVar38._8_4_;
  uStack_1bc = auVar38._12_4_;
  auVar38 = pmovsxwd(auVar34,auVar34);
  local_1b8 = auVar56._0_4_ << local_48;
  uStack_1b4 = auVar56._4_4_;
  uStack_1b0 = auVar56._8_4_;
  uStack_1ac = auVar56._12_4_;
  local_1a8 = auVar47._0_4_ << local_48;
  uStack_1a4 = auVar47._4_4_;
  uStack_1a0 = auVar47._8_4_;
  uStack_19c = auVar47._12_4_;
  local_198 = auVar36._0_4_ << local_48;
  uStack_194 = auVar36._4_4_;
  uStack_190 = auVar36._8_4_;
  uStack_18c = auVar36._12_4_;
  local_188 = auVar53._0_4_ << local_48;
  uStack_184 = auVar53._4_4_;
  uStack_180 = auVar53._8_4_;
  uStack_17c = auVar53._12_4_;
  local_178 = auVar35._0_4_ << local_48;
  uStack_174 = auVar35._4_4_;
  uStack_170 = auVar35._8_4_;
  uStack_16c = auVar35._12_4_;
  local_168._0_4_ = auVar41._0_4_ << local_48;
  local_168._4_4_ = auVar41._4_4_;
  local_168._8_4_ = auVar41._8_4_;
  local_168._12_4_ = auVar41._12_4_;
  local_158 = auVar33._0_4_ << local_48;
  uStack_154 = auVar33._4_4_;
  uStack_150 = auVar33._8_4_;
  uStack_14c = auVar33._12_4_;
  local_148 = auVar38._0_4_ << local_48;
  uStack_144 = auVar38._4_4_;
  uStack_140 = auVar38._8_4_;
  uStack_13c = auVar38._12_4_;
  auVar38 = *(undefined1 (*) [16])(*pauVar2 + lVar20 * 2);
  auVar33 = *(undefined1 (*) [16])(*pauVar2 + lVar22 * 2);
  auVar43 = *(undefined1 (*) [16])(*pauVar2 + lVar23 * 2);
  auVar32 = *(undefined1 (*) [16])(*pauVar2 + lVar24 * 2);
  auVar36 = *pauVar2;
  auVar35 = *(undefined1 (*) [16])(*pauVar2 + lVar25 * 2);
  auVar41 = *(undefined1 (*) [16])(*pauVar2 + lVar26 * 2);
  auVar34 = pmovsxwd(local_168,auVar36);
  local_138 = auVar34._0_4_ << local_48;
  uStack_134 = auVar34._4_4_;
  uStack_130 = auVar34._8_4_;
  uStack_12c = auVar34._12_4_;
  auVar34 = *(undefined1 (*) [16])(*pauVar2 + lVar28 * 2);
  auVar60._8_4_ = auVar36._8_4_;
  auVar60._12_4_ = auVar36._12_4_;
  auVar60._0_8_ = auVar36._8_8_;
  auVar36 = pmovsxwd(auVar60,auVar60);
  local_128._0_4_ = auVar36._0_4_ << local_48;
  local_128._4_4_ = auVar36._4_4_;
  local_128._8_4_ = auVar36._8_4_;
  local_128._12_4_ = auVar36._12_4_;
  auVar36 = pmovsxwd(local_128,auVar38);
  local_118 = auVar36._0_4_ << local_48;
  uStack_114 = auVar36._4_4_;
  uStack_110 = auVar36._8_4_;
  uStack_10c = auVar36._12_4_;
  auVar55._8_4_ = auVar38._8_4_;
  auVar55._12_4_ = auVar38._12_4_;
  auVar55._0_8_ = auVar38._8_8_;
  auVar38 = pmovsxwd(auVar55,auVar55);
  local_108._0_4_ = auVar38._0_4_ << local_48;
  local_108._4_4_ = auVar38._4_4_;
  local_108._8_4_ = auVar38._8_4_;
  local_108._12_4_ = auVar38._12_4_;
  auVar38 = pmovsxwd(local_108,auVar33);
  local_f8 = auVar38._0_4_ << local_48;
  uStack_f4 = auVar38._4_4_;
  uStack_f0 = auVar38._8_4_;
  uStack_ec = auVar38._12_4_;
  auVar50._8_4_ = auVar33._8_4_;
  auVar50._12_4_ = auVar33._12_4_;
  auVar50._0_8_ = auVar33._8_8_;
  auVar38 = pmovsxwd(auVar50,auVar50);
  local_e8._0_4_ = auVar38._0_4_ << local_48;
  local_e8._4_4_ = auVar38._4_4_;
  local_e8._8_4_ = auVar38._8_4_;
  local_e8._12_4_ = auVar38._12_4_;
  auVar38 = pmovsxwd(local_e8,auVar43);
  local_d8._0_4_ = auVar38._0_4_ << local_48;
  local_d8._4_4_ = auVar38._4_4_;
  local_d8._8_4_ = auVar38._8_4_;
  local_d8._12_4_ = auVar38._12_4_;
  auVar33 = pmovsxwd(local_d8,auVar32);
  auVar46._8_4_ = auVar43._8_4_;
  auVar46._12_4_ = auVar43._12_4_;
  auVar46._0_8_ = auVar43._8_8_;
  auVar38 = pmovsxwd(auVar46,auVar46);
  local_c8 = auVar38._0_4_ << local_48;
  uStack_c4 = auVar38._4_4_;
  uStack_c0 = auVar38._8_4_;
  uStack_bc = auVar38._12_4_;
  local_b8 = auVar33._0_4_ << local_48;
  uStack_b4 = auVar33._4_4_;
  uStack_b0 = auVar33._8_4_;
  uStack_ac = auVar33._12_4_;
  auVar63._8_4_ = auVar32._8_4_;
  auVar63._12_4_ = auVar32._12_4_;
  auVar63._0_8_ = auVar32._8_8_;
  auVar38 = pmovsxwd(auVar63,auVar63);
  local_a8._0_4_ = auVar38._0_4_ << local_48;
  local_a8._4_4_ = auVar38._4_4_;
  local_a8._8_4_ = auVar38._8_4_;
  local_a8._12_4_ = auVar38._12_4_;
  auVar38 = pmovsxwd(local_a8,auVar35);
  local_98 = auVar38._0_4_ << local_48;
  uStack_94 = auVar38._4_4_;
  uStack_90 = auVar38._8_4_;
  uStack_8c = auVar38._12_4_;
  auVar56._8_4_ = auVar35._8_4_;
  auVar56._12_4_ = auVar35._12_4_;
  auVar56._0_8_ = auVar35._8_8_;
  auVar38 = pmovsxwd(auVar56,auVar56);
  local_88._0_4_ = auVar38._0_4_ << local_48;
  local_88._4_4_ = auVar38._4_4_;
  local_88._8_4_ = auVar38._8_4_;
  local_88._12_4_ = auVar38._12_4_;
  auVar38 = pmovsxwd(local_88,auVar41);
  local_78 = auVar38._0_4_ << local_48;
  uStack_74 = auVar38._4_4_;
  uStack_70 = auVar38._8_4_;
  uStack_6c = auVar38._12_4_;
  auVar32._8_4_ = auVar41._8_4_;
  auVar32._12_4_ = auVar41._12_4_;
  auVar32._0_8_ = auVar41._8_8_;
  auVar38 = pmovsxwd(auVar32,auVar32);
  local_68._0_4_ = auVar38._0_4_ << local_48;
  local_68._4_4_ = auVar38._4_4_;
  local_68._8_4_ = auVar38._8_4_;
  local_68._12_4_ = auVar38._12_4_;
  auVar38 = pmovsxwd(local_68,auVar34);
  auVar41._0_8_ = auVar34._8_8_;
  auVar41._8_4_ = auVar34._8_4_;
  auVar41._12_4_ = auVar34._12_4_;
  auVar33 = pmovsxwd(auVar41,auVar41);
  local_58 = auVar38._0_4_ << local_48;
  uStack_54 = auVar38._4_4_;
  uStack_50 = auVar38._8_4_;
  uStack_4c = auVar38._12_4_;
  local_48 = auVar33._0_4_ << local_48;
  uStack_44 = auVar33._4_4_;
  uStack_40 = auVar33._8_4_;
  uStack_3c = auVar33._12_4_;
  uVar30 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_type) << 3);
  pcVar7 = *(code **)((long)col_highbd_txfm8x32_arr + uVar30);
  pcVar8 = *(code **)((long)row_highbd_txfm32x8_arr + uVar30);
  (*pcVar7)(local_438,local_438,0xc,2);
  (*pcVar7)(local_428,local_428,0xc);
  col_txfm_16x16_rounding(&local_438,-(int)piVar19[1]);
  piVar21 = coeff + 0x60;
  lVar20 = 0;
  do {
    lVar22 = 0;
    do {
      puVar3 = (undefined4 *)(puVar29 + lVar22 * 8 + -0x60);
      uVar14 = puVar3[1];
      puVar4 = (undefined4 *)(puVar29 + lVar22 * 8 + -0x40);
      uVar9 = puVar4[1];
      puVar5 = (undefined4 *)(puVar29 + lVar22 * 8 + -0x20);
      uVar15 = *puVar5;
      uVar16 = puVar5[1];
      uVar17 = puVar5[2];
      uVar18 = puVar5[3];
      puVar5 = (undefined4 *)(puVar29 + lVar22 * 8);
      uVar10 = *puVar5;
      uVar11 = puVar5[1];
      uVar12 = puVar5[2];
      uVar13 = puVar5[3];
      auVar31._0_8_ = CONCAT44(puVar4[2],puVar3[2]);
      auVar31._8_4_ = puVar3[3];
      auVar31._12_4_ = puVar4[3];
      puVar6 = (undefined8 *)((long)piVar21 + lVar22 + -0x180);
      *puVar6 = CONCAT44(*puVar4,*puVar3);
      puVar6[1] = CONCAT44(uVar10,uVar15);
      *(undefined4 *)((long)piVar21 + lVar22 + -0xf8) = uVar14;
      *(undefined4 *)((long)piVar21 + lVar22 + -0xf4) = uVar9;
      *(undefined4 *)((long)piVar21 + lVar22 + -0xf0) = uVar16;
      *(undefined4 *)((long)piVar21 + lVar22 + -0xec) = uVar11;
      puVar6 = (undefined8 *)((long)piVar21 + lVar22 + -0x80);
      *puVar6 = auVar31._0_8_;
      *(undefined4 *)(puVar6 + 1) = uVar17;
      *(undefined4 *)((long)puVar6 + 0xc) = uVar12;
      puVar6 = (undefined8 *)((long)piVar21 + lVar22);
      *puVar6 = auVar31._8_8_;
      *(undefined4 *)(puVar6 + 2) = uVar18;
      *(undefined4 *)((long)puVar6 + 0x14) = uVar13;
      lVar22 = lVar22 + 0x10;
    } while (lVar22 != 0x80);
    lVar20 = lVar20 + 1;
    puVar29 = puVar29 + 0x10;
    piVar21 = piVar21 + 0x80;
  } while (lVar20 != 2);
  uVar30 = 0xfffffffffffffffe;
  do {
    (*pcVar8)(coeff,coeff,0xc,8);
    uVar30 = uVar30 + 2;
    coeff = coeff + 8;
  } while (uVar30 < 6);
  return;
}

Assistant:

void av1_fwd_txfm2d_8x32_sse4_1(const int16_t *input, int32_t *coeff,
                                int stride, TX_TYPE tx_type, int bd) {
  __m128i in[64];
  __m128i *outcoef128 = (__m128i *)coeff;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_8X32];
  const int txw_idx = get_txw_idx(TX_8X32);
  const int txh_idx = get_txh_idx(TX_8X32);
  const fwd_transform_1d_sse4_1 col_txfm = col_highbd_txfm8x32_arr[tx_type];
  const fwd_transform_1d_sse4_1 row_txfm = row_highbd_txfm32x8_arr[tx_type];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];

  const int txfm_size_col = tx_size_wide[TX_8X32];
  const int txfm_size_row = tx_size_high[TX_8X32];
  const int num_col = txfm_size_col >> 2;

  // column transform
  load_buffer_8x16(input, in, stride, 0, 0, shift[0]);
  load_buffer_8x16(input + (txfm_size_row >> 1) * stride, in + txfm_size_row,
                   stride, 0, 0, shift[0]);

  for (int i = 0; i < num_col; i++) {
    col_txfm((in + i), (in + i), bitcol, num_col);
  }
  col_txfm_16x16_rounding(in, -shift[1]);
  transpose_8nx8n(in, outcoef128, txfm_size_col, txfm_size_row);

  // row transform
  for (int i = 0; i < txfm_size_col; i += 2) {
    row_txfm((outcoef128 + i), (outcoef128 + i), bitrow, txfm_size_col);
  }
  (void)bd;
}